

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawUtil.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)16>_> *
vkt::drawutil::makePipelineLayout
          (Move<vk::Handle<(vk::HandleType)16>_> *__return_storage_ptr__,DeviceInterface *vk,
          VkDevice device,VkDescriptorSetLayout descriptorSetLayout)

{
  undefined1 local_58 [8];
  VkPipelineLayoutCreateInfo info;
  VkDevice device_local;
  DeviceInterface *vk_local;
  VkDescriptorSetLayout descriptorSetLayout_local;
  
  local_58._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
  info.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  info._4_4_ = 0;
  info.pNext._0_4_ = 0;
  info.pNext._4_4_ = 1;
  info._16_8_ = &vk_local;
  info.pSetLayouts._0_4_ = 0;
  info.pushConstantRangeCount = 0;
  info._36_4_ = 0;
  info.pPushConstantRanges = (VkPushConstantRange *)device;
  vk_local = (DeviceInterface *)descriptorSetLayout.m_internal;
  descriptorSetLayout_local.m_internal = (deUint64)__return_storage_ptr__;
  ::vk::createPipelineLayout
            (__return_storage_ptr__,vk,device,(VkPipelineLayoutCreateInfo *)local_58,
             (VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Move<VkPipelineLayout> makePipelineLayout (const DeviceInterface&		vk,
										   const VkDevice				device,
										   const VkDescriptorSetLayout	descriptorSetLayout)
{
	const VkPipelineLayoutCreateInfo info =
	{
		VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO,		// VkStructureType				sType;
		DE_NULL,											// const void*					pNext;
		(VkPipelineLayoutCreateFlags)0,						// VkPipelineLayoutCreateFlags	flags;
		1u,													// deUint32						setLayoutCount;
		&descriptorSetLayout,								// const VkDescriptorSetLayout*	pSetLayouts;
		0u,													// deUint32						pushConstantRangeCount;
		DE_NULL,											// const VkPushConstantRange*	pPushConstantRanges;
	};
	return createPipelineLayout(vk, device, &info);
}